

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_node __thiscall
pugi::xml_node::first_element_by_path(xml_node *this,char_t *path_,char_t delimiter)

{
  char *pcVar1;
  ulong uVar2;
  char cVar3;
  long lVar4;
  long lVar5;
  char_t *pcVar6;
  xml_node *this_00;
  ulong uVar7;
  ulong uVar8;
  char_t *pcVar9;
  char_t *path__00;
  xml_node_struct *pxVar10;
  xml_node subsearch;
  xml_node local_50;
  xml_node local_48;
  xml_node local_40;
  int local_34;
  
  if (*path_ == delimiter) {
    pxVar10 = this->_root;
    if (pxVar10 == (xml_node_struct *)0x0) {
      xml_node(&local_50);
    }
    else {
      xml_node(&local_50,
               (xml_node_struct *)(*(long *)((long)pxVar10 - (pxVar10->header >> 8)) + -0x40));
    }
  }
  else {
    local_50 = (xml_node)this->_root;
  }
  local_40._root = local_50._root;
  if (local_50._root == (xml_node_struct *)0x0) {
LAB_00185853:
    xml_node(&local_48);
  }
  else {
    pcVar9 = path_ + -3;
    do {
      pcVar6 = pcVar9;
      cVar3 = pcVar6[3];
      pcVar9 = pcVar6 + 1;
    } while (cVar3 == delimiter);
    uVar8 = 0;
    do {
      uVar7 = uVar8;
      uVar8 = uVar7 + 1;
      if (pcVar6[uVar7 + 3] == '\0') break;
    } while (pcVar6[uVar7 + 3] != delimiter);
    if (uVar8 == 1) {
      return (xml_node)local_50._root;
    }
    pcVar9 = pcVar6 + 1 + uVar8;
    do {
      path__00 = pcVar9 + 1;
      pcVar1 = pcVar9 + 1;
      pcVar9 = path__00;
    } while (*pcVar1 == delimiter);
    if (uVar8 == 2 && cVar3 == '.') {
      this_00 = &local_40;
    }
    else {
      if (((cVar3 != '.') || (uVar8 != 3)) || (pcVar6[4] != '.')) {
        pxVar10 = (local_50._root)->first_child;
        if (pxVar10 != (xml_node_struct *)0x0) {
          local_34 = (int)delimiter;
          do {
            pcVar1 = pxVar10->name;
            if ((pcVar1 != (char *)0x0) && (*pcVar1 == pcVar6[3])) {
              uVar8 = 0;
              do {
                if (uVar7 - 1 == uVar8) goto LAB_00185814;
                lVar4 = uVar8 + 1;
                uVar2 = uVar8 + 1;
                lVar5 = uVar8 + 4;
                uVar8 = uVar2;
              } while (pcVar1[lVar4] == pcVar6[lVar5]);
              if (uVar7 <= uVar2) {
LAB_00185814:
                if (pcVar1[uVar7] == '\0') {
                  xml_node(&local_50,pxVar10);
                  local_48 = first_element_by_path(&local_50,path__00,(char_t)local_34);
                  if (local_48._root != (xml_node_struct *)0x0) {
                    return (xml_node)local_48._root;
                  }
                }
              }
            }
            pxVar10 = pxVar10->next_sibling;
          } while (pxVar10 != (xml_node_struct *)0x0);
        }
        goto LAB_00185853;
      }
      if (local_50._root == (xml_node_struct *)0x0) {
        xml_node(&local_50);
      }
      else {
        xml_node(&local_50,(local_50._root)->parent);
      }
      this_00 = &local_50;
    }
    local_48 = first_element_by_path(this_00,path__00,delimiter);
  }
  return (xml_node)local_48._root;
}

Assistant:

PUGI__FN xml_node xml_node::first_element_by_path(const char_t* path_, char_t delimiter) const
	{
		xml_node context = path_[0] == delimiter ? root() : *this;

		if (!context._root) return xml_node();

		const char_t* path_segment = path_;

		while (*path_segment == delimiter) ++path_segment;

		const char_t* path_segment_end = path_segment;

		while (*path_segment_end && *path_segment_end != delimiter) ++path_segment_end;

		if (path_segment == path_segment_end) return context;

		const char_t* next_segment = path_segment_end;

		while (*next_segment == delimiter) ++next_segment;

		if (*path_segment == '.' && path_segment + 1 == path_segment_end)
			return context.first_element_by_path(next_segment, delimiter);
		else if (*path_segment == '.' && *(path_segment+1) == '.' && path_segment + 2 == path_segment_end)
			return context.parent().first_element_by_path(next_segment, delimiter);
		else
		{
			for (xml_node_struct* j = context._root->first_child; j; j = j->next_sibling)
			{
				if (j->name && impl::strequalrange(j->name, path_segment, static_cast<size_t>(path_segment_end - path_segment)))
				{
					xml_node subsearch = xml_node(j).first_element_by_path(next_segment, delimiter);

					if (subsearch) return subsearch;
				}
			}

			return xml_node();
		}
	}